

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmList.cxx
# Opt level: O2

string * __thiscall
anon_unknown.dwarf_9e8bb::StringSorter::ApplyFilter
          (string *__return_storage_ptr__,StringSorter *this,string *argument)

{
  long lVar1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_40;
  
  std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)argument);
  for (lVar1 = 0; lVar1 != 0x40; lVar1 = lVar1 + 0x20) {
    if (*(long *)((long)&this->Filters[0].super__Function_base._M_manager + lVar1) != 0) {
      std::
      function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
      ::operator()(&local_40,
                   (function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
                    *)((long)&this->Filters[0].super__Function_base._M_functor + lVar1),
                   __return_storage_ptr__);
      std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)&local_40);
      std::__cxx11::string::~string((string *)&local_40);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

std::string ApplyFilter(const std::string& argument)
  {
    std::string result = argument;
    for (auto const& filter : this->Filters) {
      if (filter != nullptr) {
        result = filter(result);
      }
    }
    return result;
  }